

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnSimdLoadLaneExpr
          (BinaryReaderInterp *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset
          ,uint64_t value)

{
  Istream *this_00;
  Index index;
  bool bVar1;
  uint32_t uVar2;
  Enum op;
  Location local_d0;
  Var local_b0;
  Opcode local_64;
  Location local_60;
  Enum local_3c;
  uint64_t local_38;
  uint64_t value_local;
  Address offset_local;
  Address alignment_log2_local;
  BinaryReaderInterp *pBStack_18;
  Index memidx_local;
  BinaryReaderInterp *this_local;
  Opcode opcode_local;
  
  local_38 = value;
  value_local = offset;
  offset_local = alignment_log2;
  alignment_log2_local._4_4_ = memidx;
  pBStack_18 = this;
  this_local._0_4_ = opcode.enum_;
  GetLocation(&local_60,this);
  index = alignment_log2_local._4_4_;
  local_64.enum_ = this_local._0_4_;
  GetLocation(&local_d0,this);
  Var::Var(&local_b0,index,&local_d0);
  uVar2 = GetAlignment(offset_local);
  local_3c = (Enum)SharedValidator::OnSimdLoadLane
                             (&this->validator_,&local_60,local_64,&local_b0,(ulong)uVar2,local_38);
  bVar1 = Failed((Result)local_3c);
  Var::~Var(&local_b0);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = this->istream_;
    op = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
    Istream::Emit(this_00,op,alignment_log2_local._4_4_,(u32)value_local,(u8)local_38);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnSimdLoadLaneExpr(Opcode opcode,
                                              Index memidx,
                                              Address alignment_log2,
                                              Address offset,
                                              uint64_t value) {
  CHECK_RESULT(validator_.OnSimdLoadLane(GetLocation(), opcode,
                                         Var(memidx, GetLocation()),
                                         GetAlignment(alignment_log2), value));
  istream_.Emit(opcode, memidx, offset, static_cast<u8>(value));
  return Result::Ok;
}